

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.h
# Opt level: O2

node_type * __thiscall
Tree<NULLC::Range>::erase(Tree<NULLC::Range> *this,node_type *node,Range *key)

{
  MySmallBlock *this_00;
  void *pvVar1;
  SmallBlock<detail::node<NULLC::Range>_> *pSVar2;
  node<NULLC::Range> *pnVar3;
  int iVar4;
  int iVar5;
  MySmallBlock *freedBlock;
  node_type *pnVar6;
  node_type *pnVar7;
  MySmallBlock *pMVar8;
  node<NULLC::Range> **ppnVar9;
  
  if (node == (node_type *)0x0) {
    return (node_type *)0x0;
  }
  pnVar7 = node;
  if (key->end < (node->key).start) {
    ppnVar9 = &node->left;
  }
  else {
    if (key->start <= (node->key).end) {
      this_00 = (MySmallBlock *)node->right;
      if ((MySmallBlock *)node->left == (MySmallBlock *)0x0) {
        pMVar8 = this_00;
        if (this_00 != (MySmallBlock *)0x0) goto LAB_002053fe;
        pnVar7 = (node_type *)0x0;
        pMVar8 = (MySmallBlock *)node;
      }
      else {
        pMVar8 = (MySmallBlock *)node->left;
        if (this_00 != (MySmallBlock *)0x0) {
          ppnVar9 = &node->right;
          key = &detail::node<NULLC::Range>::min_tree((node<NULLC::Range> *)this_00)->key;
          pvVar1 = (((node<NULLC::Range> *)key)->key).end;
          (node->key).start = (((node<NULLC::Range> *)key)->key).start;
          (node->key).end = pvVar1;
          goto LAB_00205320;
        }
LAB_002053fe:
        node->height = *(int *)(pMVar8->data + 0x20);
        pSVar2 = pMVar8->next;
        pvVar1 = *(void **)((long)pMVar8 + 8);
        pnVar3 = *(node<NULLC::Range> **)(pMVar8->data + 0x18);
        node->left = *(node<NULLC::Range> **)(pMVar8->data + 0x10);
        node->right = pnVar3;
        (node->key).start = pSVar2;
        (node->key).end = pvVar1;
      }
      pMVar8->next = (this->pool).freeBlocks;
      (this->pool).freeBlocks = pMVar8;
      if (pMVar8 == (MySmallBlock *)this->root) {
        this->root = pnVar7;
      }
      if (pnVar7 == (node_type *)0x0) {
        return (node_type *)0x0;
      }
      goto LAB_0020532e;
    }
    ppnVar9 = &node->right;
  }
LAB_00205320:
  pnVar6 = erase(this,*ppnVar9,key);
  *ppnVar9 = pnVar6;
LAB_0020532e:
  iVar4 = 0;
  iVar5 = 0;
  if (pnVar7->left != (node<NULLC::Range> *)0x0) {
    iVar5 = pnVar7->left->height;
  }
  if (pnVar7->right != (node<NULLC::Range> *)0x0) {
    iVar4 = pnVar7->right->height;
  }
  if (iVar4 < iVar5) {
    iVar4 = iVar5;
  }
  pnVar7->height = iVar4 + 1;
  iVar5 = get_balance(this,pnVar7);
  if (1 < iVar5) {
    iVar5 = get_balance(this,pnVar7->left);
    if (iVar5 < 0) {
      iVar5 = get_balance(this,pnVar7->left);
      if (-1 < iVar5) {
        return pnVar7;
      }
      pnVar6 = left_rotate(this,pnVar7->left);
      pnVar7->left = pnVar6;
    }
    pnVar7 = right_rotate(this,pnVar7);
    return pnVar7;
  }
  if (-2 < iVar5) {
    return pnVar7;
  }
  iVar5 = get_balance(this,pnVar7->right);
  if (0 < iVar5) {
    iVar5 = get_balance(this,pnVar7->right);
    if (iVar5 < 1) {
      return pnVar7;
    }
    pnVar6 = right_rotate(this,pnVar7->right);
    pnVar7->right = pnVar6;
  }
  pnVar7 = left_rotate(this,pnVar7);
  return pnVar7;
}

Assistant:

node_type* erase(node_type* node, const T& key)
	{
		if(node == NULL)
			return node;

		if(key < node->key)
		{
			node->left = erase(node->left, key);
		}else if(key > node->key){
			node->right = erase(node->right, key);
		}else{
			if((node->left == NULL) || (node->right == NULL))
			{
				node_type *temp = node->left ? node->left : node->right;

				if(temp == NULL)
				{
					temp = node;
					node = NULL;
				}else{
					*node = *temp;
				}

				pool.Deallocate(temp);

				if(temp == root)
					root = node;
			}else{
				node_type* temp = node->right->min_tree();

				node->key = temp->key;

				node->right = erase(node->right, temp->key);
			}
		}

		if(node == NULL)
			return node;

		node->height = detail::max(get_height(node->left), get_height(node->right)) + 1;

		int balance = get_balance(node);

		if(balance > 1 && get_balance(node->left) >= 0)
			return right_rotate(node);

		if(balance > 1 && get_balance(node->left) < 0)
		{
			node->left =  left_rotate(node->left);
			return right_rotate(node);
		}

		if(balance < -1 && get_balance(node->right) <= 0)
			return left_rotate(node);

		if(balance < -1 && get_balance(node->right) > 0)
		{
			node->right = right_rotate(node->right);
			return left_rotate(node);
		}

		return node;
	}